

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonReturn(JsonNode *pNode,sqlite3_context *pCtx,sqlite3_value **aReplace)

{
  char cVar1;
  u32 uVar2;
  JsonNode *pJVar3;
  size_t sVar4;
  u8 *z;
  long lVar5;
  char cVar6;
  uint uVar7;
  int iVar8;
  char *pcVar9;
  long val;
  int iVar10;
  uint uVar11;
  Mem *pMVar12;
  byte bVar13;
  int iVar14;
  code *xDel;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  char *__s;
  double r;
  double local_20;
  
  switch(pNode->eType) {
  case '\x01':
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x2400) != 0) {
      val = 1;
LAB_001e54f7:
      vdbeReleaseAndSetInt64(pMVar12,val);
      return;
    }
    (pMVar12->u).r = 4.94065645841247e-324;
    break;
  case '\x02':
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x2400) != 0) {
      val = 0;
      goto LAB_001e54f7;
    }
    (pMVar12->u).r = 0.0;
    break;
  case '\x03':
    __s = (pNode->u).zJContent;
    cVar1 = *__s;
    cVar6 = __s[cVar1 == '-'];
    if ((byte)(cVar6 - 0x30U) < 10) {
      pcVar9 = __s + (cVar1 == '-');
      lVar5 = 0;
      do {
        pcVar9 = pcVar9 + 1;
        bVar13 = cVar6 - 0x30;
        if (0xccccccccccccccb < lVar5) {
          if ((lVar5 != 0xccccccccccccccc) || ((byte)(*pcVar9 - 0x30U) < 10)) goto LAB_001e52ff;
          if (cVar6 == '8') {
            if (cVar1 != '-') goto LAB_001e52ff;
            val = -0x8000000000000000;
            goto LAB_001e54ee;
          }
          if (cVar6 == '9') goto LAB_001e52ff;
          lVar5 = (ulong)bVar13 + 0x7ffffffffffffff8;
          break;
        }
        cVar6 = *pcVar9;
        lVar5 = (ulong)bVar13 + lVar5 * 10;
      } while ((byte)(cVar6 - 0x30U) < 10);
    }
    else {
      lVar5 = 0;
    }
    val = -lVar5;
    if (cVar1 != '-') {
      val = lVar5;
    }
LAB_001e54ee:
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x2400) != 0) goto LAB_001e54f7;
    (pMVar12->u).i = val;
    break;
  case '\x04':
    __s = (pNode->u).zJContent;
LAB_001e52ff:
    if (__s == (char *)0x0) {
      uVar7 = 0;
    }
    else {
      sVar4 = strlen(__s);
      uVar7 = (uint)sVar4 & 0x3fffffff;
    }
    sqlite3AtoF(__s,&local_20,uVar7,'\x01');
    sqlite3VdbeMemSetDouble(pCtx->pOut,local_20);
    return;
  case '\x05':
    if ((pNode->jnFlags & 2) == 0) {
      z = &((pNode->u).pPatch)->jnFlags;
      uVar7 = pNode->n - 2;
      xDel = (_func_void_void_ptr *)0xffffffffffffffff;
    }
    else {
      uVar2 = pNode->n;
      pJVar3 = (pNode->u).pPatch;
      z = (u8 *)sqlite3_malloc(uVar2 + 1);
      if (z == (u8 *)0x0) {
        sqlite3_result_error_nomem(pCtx);
        return;
      }
      uVar17 = uVar2 - 1;
      uVar7 = 0;
      if (1 < uVar17) {
        uVar15 = 1;
        uVar7 = 0;
        do {
          iVar14 = (int)uVar15;
          bVar13 = (&pJVar3->eType)[uVar15];
          if (bVar13 == 0x5c) {
            bVar13 = (&pJVar3->jnFlags)[uVar15];
            iVar8 = iVar14 + 1;
            if (bVar13 < 0x6e) {
              uVar11 = 8;
              if (bVar13 != 0x62) {
                if (bVar13 != 0x66) {
LAB_001e5491:
                  if (bVar13 == 0x74) {
                    bVar13 = 9;
                  }
                  iVar16 = 1;
                  uVar15 = (ulong)uVar7;
                  iVar14 = iVar8;
                  goto LAB_001e5474;
                }
                uVar11 = 0xc;
              }
            }
            else if (bVar13 == 0x6e) {
              uVar11 = 10;
            }
            else if (bVar13 == 0x72) {
              uVar11 = 0xd;
            }
            else {
              if (bVar13 != 0x75) goto LAB_001e5491;
              iVar8 = iVar14 + 5;
              iVar16 = 0;
              uVar11 = 0;
              do {
                bVar13 = (&pJVar3->eType)[(uint)(iVar14 + 2 + iVar16)];
                iVar10 = uVar11 * 0x10;
                if ((char)bVar13 < 0x3a) {
                  iVar10 = iVar10 + -0x30;
                }
                else if (bVar13 < 0x47) {
                  iVar10 = iVar10 + -0x37;
                }
                else {
                  iVar10 = iVar10 + -0x57;
                }
                uVar11 = iVar10 + (char)bVar13;
                iVar16 = iVar16 + 1;
              } while (iVar16 != 4);
              if (uVar11 == 0) break;
              if (0x7f < uVar11) {
                uVar15 = (ulong)(uVar7 + 1);
                iVar14 = iVar8;
                if (uVar11 < 0x800) {
                  z[uVar7] = (byte)(uVar11 >> 6) | 0xc0;
                  bVar13 = (byte)uVar11 & 0x3f | 0x80;
                  iVar16 = 2;
                }
                else {
                  z[uVar7] = (byte)(uVar11 >> 0xc) | 0xe0;
                  uVar15 = (ulong)(uVar7 + 2);
                  z[uVar7 + 1] = (byte)(uVar11 >> 6) & 0x3f | 0x80;
                  bVar13 = (byte)uVar11 & 0x3f | 0x80;
                  iVar16 = 3;
                }
                goto LAB_001e5474;
              }
            }
            bVar13 = (byte)uVar11;
            iVar16 = 1;
            uVar15 = (ulong)uVar7;
            iVar14 = iVar8;
          }
          else {
            iVar16 = 1;
            uVar15 = (ulong)uVar7;
          }
LAB_001e5474:
          uVar7 = uVar7 + iVar16;
          z[uVar15] = bVar13;
          uVar15 = (ulong)(iVar14 + 1U);
        } while (iVar14 + 1U < uVar17);
      }
      z[uVar7] = '\0';
      xDel = sqlite3_free;
    }
    setResultStrOrError(pCtx,(char *)z,uVar7,'\x01',xDel);
    return;
  case '\x06':
  case '\a':
    jsonReturnJson(pNode,pCtx,(sqlite3_value **)0x0);
    return;
  default:
    pMVar12 = pCtx->pOut;
    if ((pMVar12->flags & 0x2400) == 0) {
      pMVar12->flags = 1;
      return;
    }
    vdbeMemClearExternAndSetNull(pMVar12);
    return;
  }
  pMVar12->flags = 4;
  return;
}

Assistant:

static void jsonReturn(
  JsonNode *pNode,            /* Node to return */
  sqlite3_context *pCtx,      /* Return value for this function */
  sqlite3_value **aReplace    /* Array of replacement values */
){
  switch( pNode->eType ){
    default: {
      assert( pNode->eType==JSON_NULL );
      sqlite3_result_null(pCtx);
      break;
    }
    case JSON_TRUE: {
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSON_FALSE: {
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSON_INT: {
      sqlite3_int64 i = 0;
      const char *z = pNode->u.zJContent;
      if( z[0]=='-' ){ z++; }
      while( z[0]>='0' && z[0]<='9' ){
        unsigned v = *(z++) - '0';
        if( i>=LARGEST_INT64/10 ){
          if( i>LARGEST_INT64/10 ) goto int_as_real;
          if( z[0]>='0' && z[0]<='9' ) goto int_as_real;
          if( v==9 ) goto int_as_real;
          if( v==8 ){
            if( pNode->u.zJContent[0]=='-' ){
              sqlite3_result_int64(pCtx, SMALLEST_INT64);
              goto int_done;
            }else{
              goto int_as_real;
            }
          }
        }
        i = i*10 + v;
      }
      if( pNode->u.zJContent[0]=='-' ){ i = -i; }
      sqlite3_result_int64(pCtx, i);
      int_done:
      break;
      int_as_real: /* fall through to real */;
    }
    case JSON_REAL: {
      double r;
#ifdef SQLITE_AMALGAMATION
      const char *z = pNode->u.zJContent;
      sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
#else
      r = strtod(pNode->u.zJContent, 0);
#endif
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSON_STRING: {
#if 0 /* Never happens because JNODE_RAW is only set by json_set(),
      ** json_insert() and json_replace() and those routines do not
      ** call jsonReturn() */
      if( pNode->jnFlags & JNODE_RAW ){
        sqlite3_result_text(pCtx, pNode->u.zJContent, pNode->n,
                            SQLITE_TRANSIENT);
      }else 
#endif
      assert( (pNode->jnFlags & JNODE_RAW)==0 );
      if( (pNode->jnFlags & JNODE_ESCAPE)==0 ){
        /* JSON formatted without any backslash-escapes */
        sqlite3_result_text(pCtx, pNode->u.zJContent+1, pNode->n-2,
                            SQLITE_TRANSIENT);
      }else{
        /* Translate JSON formatted string into raw text */
        u32 i;
        u32 n = pNode->n;
        const char *z = pNode->u.zJContent;
        char *zOut;
        u32 j;
        zOut = sqlite3_malloc( n+1 );
        if( zOut==0 ){
          sqlite3_result_error_nomem(pCtx);
          break;
        }
        for(i=1, j=0; i<n-1; i++){
          char c = z[i];
          if( c!='\\' ){
            zOut[j++] = c;
          }else{
            c = z[++i];
            if( c=='u' ){
              u32 v = 0, k;
              for(k=0; k<4; i++, k++){
                assert( i<n-2 );
                c = z[i+1];
                assert( safe_isxdigit(c) );
                if( c<='9' ) v = v*16 + c - '0';
                else if( c<='F' ) v = v*16 + c - 'A' + 10;
                else v = v*16 + c - 'a' + 10;
              }
              if( v==0 ) break;
              if( v<=0x7f ){
                zOut[j++] = (char)v;
              }else if( v<=0x7ff ){
                zOut[j++] = (char)(0xc0 | (v>>6));
                zOut[j++] = 0x80 | (v&0x3f);
              }else{
                zOut[j++] = (char)(0xe0 | (v>>12));
                zOut[j++] = 0x80 | ((v>>6)&0x3f);
                zOut[j++] = 0x80 | (v&0x3f);
              }
            }else{
              if( c=='b' ){
                c = '\b';
              }else if( c=='f' ){
                c = '\f';
              }else if( c=='n' ){
                c = '\n';
              }else if( c=='r' ){
                c = '\r';
              }else if( c=='t' ){
                c = '\t';
              }
              zOut[j++] = c;
            }
          }
        }
        zOut[j] = 0;
        sqlite3_result_text(pCtx, zOut, j, sqlite3_free);
      }
      break;
    }
    case JSON_ARRAY:
    case JSON_OBJECT: {
      jsonReturnJson(pNode, pCtx, aReplace);
      break;
    }
  }
}